

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O2

void skiwi::anon_unknown_26::fold_fl_div(PrimitiveCall *p,Expression *e)

{
  Expression *e_00;
  bool bVar1;
  Flonum f2;
  Flonum f1;
  Literal lit2;
  Literal lit1;
  undefined1 local_1c8 [40];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [40];
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_138;
  undefined1 local_d8;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_d0;
  undefined1 local_70;
  undefined1 local_68 [40];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0x1e0) {
    local_d0._32_8_ = local_d0._M_first._M_storage._M_storage + 0x30;
    local_d0._0_8_ = 0xffffffffffffffff;
    local_d0._M_first._M_storage._M_storage[9] = '\0';
    local_d0._16_8_ = 0;
    local_d0._24_8_ = 0;
    local_d0._40_8_ = 0;
    local_138._32_8_ = local_138._M_first._M_storage._M_storage + 0x30;
    local_138._0_8_ = 0xffffffffffffffff;
    local_138._M_first._M_storage._M_storage[9] = '\0';
    local_138._16_8_ = 0;
    local_138._24_8_ = 0;
    local_138._40_8_ = 0;
    local_d0._M_first._M_storage._M_storage[0x30] = '\0';
    local_70 = 0;
    local_138._M_first._M_storage._M_storage[0x30] = '\0';
    local_d8 = 0;
    local_180._0_4_ = -1;
    local_180._4_4_ = -1;
    local_180[0x10] = false;
    local_158._M_p = (pointer)&local_148;
    local_180._24_8_ = 0;
    local_180._32_8_ = 0;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_1c8._0_4_ = -1;
    local_1c8._4_4_ = -1;
    local_1c8[0x10] = false;
    local_1a0._M_p = (pointer)&local_190;
    local_1c8._24_8_ = 0;
    local_1c8._32_8_ = 0;
    local_198 = 0;
    local_190._M_local_buf[0] = '\0';
    bVar1 = is_literal((Literal *)&local_d0._M_first,e_00);
    if (bVar1) {
      bVar1 = is_literal((Literal *)&local_138._M_first,
                         (p->arguments).
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      if (bVar1) {
        bVar1 = is_flonum((Flonum *)local_180,(Literal *)&local_d0._M_first);
        if (bVar1) {
          bVar1 = is_flonum((Flonum *)local_1c8,(Literal *)&local_138._M_first);
          if (bVar1) {
            local_68._0_4_ = -1;
            local_68._4_4_ = -1;
            local_68[0x10] = false;
            local_40._M_p = (pointer)&local_30;
            local_68._24_8_ = 0;
            local_68._32_8_ = 0;
            local_38 = 0;
            local_68._8_8_ = (double)local_180._8_8_ / (double)local_1c8._8_8_;
            local_30._M_local_buf[0] = '\0';
            std::
            variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
            ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                         *)e,(Flonum *)local_68);
            std::__cxx11::string::~string((string *)&local_40);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_138._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_d0._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0x1b0,
                "void skiwi::(anonymous namespace)::fold_fl_div(PrimitiveCall &, Expression &)");
}

Assistant:

void fold_fl_div(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 2);
    Literal lit1, lit2;
    Flonum f1, f2;
    if (is_literal(lit1, p.arguments[0]) && is_literal(lit2, p.arguments[1]))
      {
      if (is_flonum(f1, lit1) && is_flonum(f2, lit2))
        {
        e = make_flonum(f1.value / f2.value);
        }
      }
    }